

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSearch.cpp
# Opt level: O1

void __thiscall HighsSearch::currentNodeToQueue(HighsSearch *this,HighsNodeQueue *nodequeue)

{
  HighsDomain *this_00;
  pointer piVar1;
  pointer piVar2;
  pointer pNVar3;
  char cVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  vector<int,_std::allocator<int>_> branchPositions;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> domchgStack;
  vector<int,_std::allocator<int>_> local_58;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> local_38;
  
  this_00 = &this->localdom;
  dVar6 = (this->nodestack).
          super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].lower_bound;
  dVar5 = ((this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->upper_limit;
  dVar7 = this->upper_limit;
  if (dVar5 <= this->upper_limit) {
    dVar7 = dVar5;
  }
  cVar4 = dVar7 < dVar6;
  if (dVar7 < dVar6) {
LAB_002e71a8:
    if (cVar4 == '\0') {
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      HighsDomain::getReducedDomainChangeStack(&local_38,this_00,&local_58);
      if ((this->localdom).objProp_.numInfObjLower == 0) {
        dVar6 = (this->localdom).objProp_.objectiveLower.hi +
                (this->localdom).objProp_.objectiveLower.lo;
      }
      else {
        dVar6 = -INFINITY;
      }
      pNVar3 = (this->nodestack).
               super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if ((this->localdom).objProp_.domain == (HighsDomain *)0x0) {
        dVar6 = -INFINITY;
      }
      if (dVar6 <= pNVar3[-1].lower_bound) {
        dVar6 = pNVar3[-1].lower_bound;
      }
      dVar6 = HighsNodeQueue::emplaceNode
                        (nodequeue,&local_38,&local_58,dVar6,pNVar3[-1].estimate,
                         (int)((ulong)((long)pNVar3 -
                                      (long)(this->nodestack).
                                            super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 5) *
                         -0x55555555 + this->depthoffset);
      if (this->countTreeWeight == true) {
        dVar5 = (this->treeweight).hi;
        dVar7 = dVar6 + dVar5;
        (this->treeweight).hi = dVar7;
        (this->treeweight).lo =
             (dVar5 - (dVar7 - dVar6)) + (dVar6 - (dVar7 - (dVar7 - dVar6))) + (this->treeweight).lo
        ;
      }
      if (local_38.super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_38.
                        super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_58.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      goto LAB_002e731e;
    }
  }
  else {
    piVar1 = (this->localdom).changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    piVar2 = (this->localdom).changedcols_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    HighsDomain::propagate(this_00);
    HighsDomain::clearChangedCols(this_00,(HighsInt)((ulong)((long)piVar1 - (long)piVar2) >> 2));
    cVar4 = (this->localdom).infeasible_;
    if ((bool)cVar4 != true) goto LAB_002e71a8;
    HighsDomain::conflictAnalysis
              (this_00,&((this->mipsolver->mipdata_)._M_t.
                         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                         .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->
                        conflictPool);
  }
  if (this->countTreeWeight == true) {
    dVar5 = ldexp(1.0,((int)((ulong)((long)(this->nodestack).
                                           super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->nodestack).
                                          super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 5) *
                       0x55555555 - this->depthoffset) + 1);
    dVar6 = (this->treeweight).hi;
    dVar7 = dVar5 + dVar6;
    (this->treeweight).hi = dVar7;
    (this->treeweight).lo =
         (dVar6 - (dVar7 - dVar5)) + (dVar5 - (dVar7 - (dVar7 - dVar5))) + (this->treeweight).lo;
  }
LAB_002e731e:
  (this->nodestack).
  super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>._M_impl.
  super__Vector_impl_data._M_finish[-1].opensubtrees = '\0';
  return;
}

Assistant:

void HighsSearch::currentNodeToQueue(HighsNodeQueue& nodequeue) {
  auto oldchangedcols = localdom.getChangedCols().size();
  bool prune = nodestack.back().lower_bound > getCutoffBound();
  if (!prune) {
    localdom.propagate();
    localdom.clearChangedCols(oldchangedcols);
    prune = localdom.infeasible();
    if (prune) localdom.conflictAnalysis(mipsolver.mipdata_->conflictPool);
  }
  if (!prune) {
    std::vector<HighsInt> branchPositions;
    auto domchgStack = localdom.getReducedDomainChangeStack(branchPositions);
    double tmpTreeWeight = nodequeue.emplaceNode(
        std::move(domchgStack), std::move(branchPositions),
        std::max(nodestack.back().lower_bound,
                 localdom.getObjectiveLowerBound()),
        nodestack.back().estimate, getCurrentDepth());
    if (countTreeWeight) treeweight += tmpTreeWeight;
  } else {
    mipsolver.mipdata_->debugSolution.nodePruned(localdom);
    if (countTreeWeight) treeweight += std::ldexp(1.0, 1 - getCurrentDepth());
  }
  nodestack.back().opensubtrees = 0;
}